

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::SamplePosRasterizationTest::~SamplePosRasterizationTest
          (SamplePosRasterizationTest *this)

{
  ~SamplePosRasterizationTest(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

SamplePosRasterizationTest::~SamplePosRasterizationTest (void)
{
	deinit();
}